

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O1

void __thiscall
iutest::detail::ParamTestSuiteInfo<RenameParamTest>::OnRegisterTests
          (ParamTestSuiteInfo<RenameParamTest> *this,IParamTestInfoData *infodata)

{
  pfnParamNameGeneratorFunc p_Var1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ParamGenerator *pPVar6;
  undefined4 extraout_var;
  ostream *poVar7;
  undefined4 extraout_var_00;
  pointer generator_name;
  size_t sVar8;
  string name;
  string testsuite_name;
  allocator<char> local_279;
  IParamTestInfoData *local_278;
  string local_270;
  long *local_250;
  long local_248;
  long local_240 [2];
  string local_230;
  string local_210;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  pointer local_1d0;
  ParamTestSuiteInfo<RenameParamTest> *local_1c8;
  undefined1 local_1c0 [24];
  ostream local_1a8;
  
  generator_name =
       (this->m_instantiation).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1d0 = (this->m_instantiation).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iutest::detail::ParamTestSuiteInfo<RenameParamTest>::Functor>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (generator_name != local_1d0) {
    local_278 = infodata;
    local_1c8 = this;
    do {
      pPVar6 = (*(generator_name->second).CreateGen)();
      CreateTestSuiteName(&local_210,local_1c8,&generator_name->first);
      iVar4 = (*local_278->_vptr_IParamTestInfoData[2])
                        (local_278,&local_210,
                         &internal::helper::TestTypeIdHelper<RenameParamTest>::_dummy,0,0);
      if (pPVar6 != (ParamGenerator *)0x0) {
        (*pPVar6->_vptr_iuIParamGenerator[2])();
        sVar8 = 0;
        while( true ) {
          cVar2 = (*pPVar6->_vptr_iuIParamGenerator[5])(pPVar6);
          if (cVar2 != '\0') break;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_250,(local_278->m_name)._M_dataplus._M_p,&local_279);
          p_Var1 = (generator_name->second).ParamNameGen;
          (*pPVar6->_vptr_iuIParamGenerator[3])(&local_1f0);
          local_1c0._0_8_ = local_1c0 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1c0,local_1f0,local_1e8 + (long)local_1f0);
          local_1a8._8_8_ = sVar8;
          (*p_Var1)(&local_230,
                    (TestParamInfo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_1c0);
          if (local_230._M_string_length == 0) {
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_270,local_250,local_248 + (long)local_250);
          }
          else {
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_270,local_250,local_248 + (long)local_250);
            std::__cxx11::string::append((char *)&local_270);
            std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_230._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
            operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
          }
          if (local_1f0 != local_1e0) {
            operator_delete(local_1f0,local_1e0[0] + 1);
          }
          if (local_250 != local_240) {
            operator_delete(local_250,local_240[0] + 1);
          }
          bVar3 = CheckTestName((TestSuite *)CONCAT44(extraout_var,iVar4),&local_270);
          if (!bVar3) {
            IUTestLog::IUTestLog
                      ((IUTestLog *)local_1c0,LOG_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/internal/iutest_params_util.hpp"
                       ,0xcb);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (&local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_270._M_dataplus._M_p,local_270._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," is already exist.",0x12);
            IUTestLog::~IUTestLog((IUTestLog *)local_1c0);
          }
          iVar5 = (*local_278->_vptr_IParamTestInfoData[3])
                            (local_278,(TestSuite *)CONCAT44(extraout_var,iVar4),&local_270);
          (*pPVar6->_vptr_iuIParamGenerator[3])(local_1c0);
          (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x10))
                    ((long *)CONCAT44(extraout_var_00,iVar5),local_1c0);
          if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
            operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
          }
          sVar8 = sVar8 + 1;
          (*pPVar6->_vptr_iuIParamGenerator[4])(pPVar6);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if (pPVar6 != (ParamGenerator *)0x0) {
        (*pPVar6->_vptr_iuIParamGenerator[1])();
      }
      generator_name = generator_name + 1;
    } while (generator_name != local_1d0);
  }
  return;
}

Assistant:

virtual void OnRegisterTests(IParamTestInfoData* infodata) const IUTEST_CXX_OVERRIDE
    {
        for( typename InstantiationContainer::const_iterator gen_it=m_instantiation.begin()
            , gen_end=m_instantiation.end(); gen_it != gen_end; ++gen_it )
        {
            // パラメータ生成器の作成
            detail::scoped_ptr<ParamGenerator> p((gen_it->second.CreateGen)());

            const ::std::string testsuite_name = CreateTestSuiteName(gen_it->first);
            const char* file = gen_it->second.m_file;
            const int line = gen_it->second.m_line;
            TestSuite* testsuite = infodata->MakeTestSuite(testsuite_name
                , internal::GetTypeId<Tester>()
                , IUTEST_GET_SETUP_TESTSUITE(Tester, file, line)
                , IUTEST_GET_TEARDOWN_TESTSUITE(Tester, file, line));

            if( p.get() != NULL )
            {
                size_t i=0;
                for( p->Begin(); !p->IsEnd(); p->Next() )
                {
                    const ::std::string name = MakeParamTestName(infodata->GetName()
                        , gen_it->second.ParamNameGen(TestParamInfo<ParamType>(p->GetCurrent(), i)) );
#if IUTEST_CHECK_STRICT
                    if( !CheckTestName(testsuite, name) )
                    {
                        IUTEST_LOG_(WARNING) << testsuite_name << "." << name << " is already exist.";
                    }
#endif
                    EachTest* test = static_cast<EachTest*>(infodata->RegisterTest(testsuite, name));
                    test->SetParam(p->GetCurrent());
                    ++i;
                }
            }
        }
    }